

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

ssize_t __thiscall
jpgd::jpeg_decoder_file_stream::read
          (jpeg_decoder_file_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  size_t sStack_30;
  
  if ((FILE *)this->m_pFile == (FILE *)0x0) {
    return -1;
  }
  sStack_30 = 0;
  if (this->m_eof_flag == false) {
    if (this->m_error_flag != false) {
      return -1;
    }
    sStack_30 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)(int)__buf,
                      (FILE *)this->m_pFile);
    if ((int)__buf <= (int)sStack_30) goto LAB_0013fef0;
    iVar1 = ferror((FILE *)this->m_pFile);
    if (iVar1 == 0) {
      this->m_eof_flag = true;
    }
    else {
      __nbytes = (size_t)&this->m_error_flag;
      sStack_30 = 0xffffffffffffffff;
    }
  }
  *(bool *)__nbytes = true;
LAB_0013fef0:
  return sStack_30 & 0xffffffff;
}

Assistant:

int jpeg_decoder_file_stream::read(uint8* pBuf, int max_bytes_to_read, bool* pEOF_flag)
	{
		if (!m_pFile)
			return -1;

		if (m_eof_flag)
		{
			*pEOF_flag = true;
			return 0;
		}

		if (m_error_flag)
			return -1;

		int bytes_read = static_cast<int>(fread(pBuf, 1, max_bytes_to_read, m_pFile));
		if (bytes_read < max_bytes_to_read)
		{
			if (ferror(m_pFile))
			{
				m_error_flag = true;
				return -1;
			}

			m_eof_flag = true;
			*pEOF_flag = true;
		}

		return bytes_read;
	}